

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O1

void __thiscall QDialogPrivate::resetModalitySetByOpen(QDialogPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  
  if (this->resetModalityTo != -1) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    bVar1 = QWidget::testAttribute_helper(this_00,WA_SetWindowModality);
    if (!bVar1) {
      QWidget::setWindowModality(this_00,this->resetModalityTo);
      QWidget::setAttribute(this_00,WA_SetWindowModality,this->wasModalitySet);
    }
  }
  this->resetModalityTo = -1;
  return;
}

Assistant:

void QDialogPrivate::resetModalitySetByOpen()
{
    Q_Q(QDialog);
    if (resetModalityTo != -1 && !q->testAttribute(Qt::WA_SetWindowModality)) {
        // open() changed the window modality and the user didn't touch it afterwards; restore it
        q->setWindowModality(Qt::WindowModality(resetModalityTo));
        q->setAttribute(Qt::WA_SetWindowModality, wasModalitySet);
#ifdef Q_OS_MAC
        Q_ASSERT(resetModalityTo != Qt::WindowModal);
        q->setParent(q->parentWidget(), Qt::Dialog);
#endif
    }
    resetModalityTo = -1;
}